

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

shared_ptr<ear::PointSourcePanner> __thiscall
ear::configureFullPolarPanner(ear *this,Layout *layout)

{
  Index *pIVar1;
  allocator<int> *paVar2;
  bool bVar3;
  pointer ppVar4;
  int *dataPtr;
  size_type size;
  reference other;
  Index IVar5;
  reference this_00;
  iterator iVar6;
  iterator iVar7;
  iterator iVar8;
  size_type sVar9;
  reference piVar10;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pDVar11;
  internal_error *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ear::PointSourcePanner> sVar12;
  undefined1 local_568 [38];
  undefined1 local_542;
  allocator<char> local_541;
  string local_540;
  unique_ptr<ear::QuadRegion,_std::default_delete<ear::QuadRegion>_> local_520;
  unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_> local_518;
  RowXpr local_510;
  int local_4d4;
  iterator iStack_4d0;
  int vert_2;
  iterator __end4;
  iterator __begin4;
  set<int,_std::less<int>,_std::allocator<int>_> *__range4;
  int rowIndex_2;
  undefined1 local_4a8 [8];
  MatrixXd positions_2;
  undefined1 local_488 [8];
  Vector4i outputChannels_2;
  undefined1 local_460 [8];
  vector<int,_std::allocator<int>_> facetVertsVec_1;
  unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_> local_440;
  RowXpr local_438;
  int local_3fc;
  iterator iStack_3f8;
  int vert_1;
  iterator __end3;
  iterator __begin3;
  set<int,_std::less<int>,_std::allocator<int>_> *__range3;
  int rowIndex_1;
  undefined1 local_3d0 [8];
  MatrixXd positions_1;
  undefined1 local_3b0 [8];
  Vector3i outputChannels_1;
  undefined1 local_390 [8];
  vector<int,_std::allocator<int>_> facetVertsVec;
  set<int,_std::less<int>,_std::allocator<int>_> *facetVerts;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *__range1_1;
  unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_> local_330;
  double local_328;
  Index local_320;
  undefined1 local_318 [8];
  VectorXd centreDownmix;
  Vector3d centrePosition;
  iterator iStack_2b0;
  int vert;
  iterator __end2;
  iterator __begin2;
  Facet *__range2;
  int rowIndex;
  undefined1 local_288 [8];
  MatrixXd positions;
  undefined1 local_268 [8];
  Map<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> outputChannels;
  undefined1 local_238 [8];
  vector<int,_std::allocator<int>_> realVertsVec;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  local_200;
  undefined1 local_1e8 [8];
  Facet realVerts;
  iterator iStack_1b0;
  int virtualVert;
  iterator __end1;
  iterator __begin1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  regions;
  undefined1 local_178 [8];
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  facets;
  _Self local_140;
  const_iterator facets_it;
  tuple<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_118;
  undefined1 local_90 [8];
  MatrixXd downmix;
  set<int,_std::less<int>,_std::allocator<int>_> virtualVerts;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  positionsNominal;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  positionsReal;
  Layout *layout_local;
  
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)&positionsNominal.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)&virtualVerts._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &downmix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_90);
  getAugmentedLayout(&local_118,layout);
  std::
  tie<std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>,std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>,std::set<int,std::less<int>,std::allocator<int>>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((tuple<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_&,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_&,_std::set<int,_std::less<int>,_std::allocator<int>_>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&>
              *)&facets_it,
             (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&positionsNominal.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&virtualVerts._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (set<int,_std::less<int>,_std::allocator<int>_> *)
             &downmix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols,(Matrix<double,__1,__1,_0,__1,__1> *)local_90);
  std::
  tuple<std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>&,std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>&,std::set<int,std::less<int>,std::allocator<int>>&,Eigen::Matrix<double,-1,-1,0,-1,-1>&>
  ::operator=((tuple<std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>&,std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>&,std::set<int,std::less<int>,std::allocator<int>>&,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
               *)&facets_it,&local_118);
  std::
  tuple<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::~tuple(&local_118);
  Layout::name_abi_cxx11_
            ((string *)
             &facets.
              super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,layout);
  local_140._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
               *)FACETS_abi_cxx11_,
              (key_type *)
              &facets.
               super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &facets.
              super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  regions.
  super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                       *)FACETS_abi_cxx11_);
  bVar3 = std::operator!=(&local_140,
                          (_Self *)&regions.
                                    super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar3) {
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
             ::operator->(&local_140);
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::vector((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              *)local_178,&ppVar4->second);
  }
  else {
    convex_hull((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 *)local_178,
                (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)&virtualVerts._M_t._M_impl.super__Rb_tree_header._M_node_count,1e-05);
  }
  std::
  vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  ::vector((vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
            *)&__range1);
  pIVar1 = &downmix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols;
  __end1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)pIVar1);
  iStack_1b0 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)pIVar1);
  while (bVar3 = std::operator!=(&__end1,&stack0xfffffffffffffe50), bVar3) {
    piVar10 = std::_Rb_tree_const_iterator<int>::operator*(&__end1);
    realVerts._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = *piVar10;
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::vector(&local_200,
             (vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              *)local_178);
    _adjacent_verts((Facet *)local_1e8,&local_200,
                    realVerts._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::~vector(&local_200);
    iVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1e8);
    iVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1e8);
    pIVar1 = &downmix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols;
    iVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)pIVar1);
    realVertsVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::set<int,_std::less<int>,_std::allocator<int>_>::end
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)pIVar1);
    bVar3 = doIntersect<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>>
                      ((_Rb_tree_const_iterator<int>)iVar6._M_node,
                       (_Rb_tree_const_iterator<int>)iVar7._M_node,
                       (_Rb_tree_const_iterator<int>)iVar8._M_node,
                       (_Rb_tree_const_iterator<int>)
                       realVertsVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    _assert_impl((bool)(~bVar3 & 1),"invalid triangulation");
    iVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1e8);
    iVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1e8);
    std::allocator<int>::allocator((allocator<int> *)&outputChannels.field_0x17);
    std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
              ((vector<int,std::allocator<int>> *)local_238,
               (_Rb_tree_const_iterator<int>)iVar6._M_node,
               (_Rb_tree_const_iterator<int>)iVar7._M_node,
               (allocator_type *)&outputChannels.field_0x17);
    std::allocator<int>::~allocator((allocator<int> *)&outputChannels.field_0x17);
    dataPtr = std::vector<int,_std::allocator<int>_>::data
                        ((vector<int,_std::allocator<int>_> *)local_238);
    size = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)local_238);
    Eigen::Stride<0,_0>::Stride
              ((Stride<0,_0> *)
               ((long)&positions.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols + 6));
    Eigen::Map<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
              ((Map<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_268,
               dataPtr,size,
               (Stride<0,_0> *)
               ((long)&positions.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols + 6));
    _rowIndex = Eigen::
                EigenBase<Eigen::Map<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                ::size((EigenBase<Eigen::Map<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                        *)local_268);
    __range2._4_4_ = 3;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)local_288,(long *)&rowIndex,
               (int *)((long)&__range2 + 4));
    __range2._0_4_ = 0;
    __end2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1e8);
    iStack_2b0 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1e8);
    while (bVar3 = std::operator!=(&__end2,&stack0xfffffffffffffd50), bVar3) {
      piVar10 = std::_Rb_tree_const_iterator<int>::operator*(&__end2);
      pDVar11 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                std::
                vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              *)&positionsNominal.
                                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)*piVar10);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                ((RowXpr *)
                 (centrePosition.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 2),
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_288,
                 (long)(int)__range2);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)
                 (centrePosition.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 2),pDVar11);
      __range2._0_4_ = (int)__range2 + 1;
      std::_Rb_tree_const_iterator<int>::operator++(&__end2);
    }
    other = std::
            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          *)&positionsNominal.
                             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (long)realVerts._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               &centreDownmix.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows,other);
    local_320 = Eigen::
                EigenBase<Eigen::Map<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                ::size((EigenBase<Eigen::Map<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                        *)local_268);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_318,&local_320);
    IVar5 = Eigen::
            EigenBase<Eigen::Map<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
            size((EigenBase<Eigen::Map<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)local_268);
    local_328 = sqrt((double)IVar5);
    local_328 = 1.0 / local_328;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::fill
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_318,&local_328);
    boost::
    make_unique<ear::VirtualNgon,Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>&,Eigen::Matrix<double,_1,_1,0,_1,_1>&,Eigen::Matrix<double,3,1,0,3,1>&,Eigen::Matrix<double,_1,1,0,_1,1>&>
              ((boost *)&__range1_1,
               (Map<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_268,
               (Matrix<double,__1,__1,_0,__1,__1> *)local_288,
               (Matrix<double,_3,_1,_0,_3,_1> *)
               &centreDownmix.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows,(Matrix<double,__1,_1,_0,__1,_1> *)local_318);
    std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>::
    unique_ptr<ear::VirtualNgon,std::default_delete<ear::VirtualNgon>,void>
              ((unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>> *)&local_330,
               (unique_ptr<ear::VirtualNgon,_std::default_delete<ear::VirtualNgon>_> *)&__range1_1);
    std::
    vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
    ::push_back((vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
                 *)&__range1,(value_type *)&local_330);
    std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>::~unique_ptr
              (&local_330);
    std::unique_ptr<ear::VirtualNgon,_std::default_delete<ear::VirtualNgon>_>::~unique_ptr
              ((unique_ptr<ear::VirtualNgon,_std::default_delete<ear::VirtualNgon>_> *)&__range1_1);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_318);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_288);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_238);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1e8);
    std::_Rb_tree_const_iterator<int>::operator++(&__end1);
  }
  __end1_1 = std::
             vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             ::begin((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      *)local_178);
  facetVerts = (set<int,_std::less<int>,_std::allocator<int>_> *)
               std::
               vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               ::end((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      *)local_178);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                        *)&facetVerts);
    if (!bVar3) {
      std::
      make_shared<ear::PolarPointSourcePanner,std::vector<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>,std::allocator<std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>>>>
                ((vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
                  *)local_568);
      std::
      make_shared<ear::PointSourcePannerDownmix,std::shared_ptr<ear::PolarPointSourcePanner>,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                ((shared_ptr<ear::PolarPointSourcePanner> *)(local_568 + 0x10),
                 (Matrix<double,__1,__1,_0,__1,__1> *)local_568);
      std::shared_ptr<ear::PointSourcePanner>::shared_ptr<ear::PointSourcePannerDownmix,void>
                ((shared_ptr<ear::PointSourcePanner> *)this,
                 (shared_ptr<ear::PointSourcePannerDownmix> *)(local_568 + 0x10));
      std::shared_ptr<ear::PointSourcePannerDownmix>::~shared_ptr
                ((shared_ptr<ear::PointSourcePannerDownmix> *)(local_568 + 0x10));
      std::shared_ptr<ear::PolarPointSourcePanner>::~shared_ptr
                ((shared_ptr<ear::PolarPointSourcePanner> *)local_568);
      std::
      vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
      ::~vector((vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
                 *)&__range1);
      std::
      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::~vector((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 *)local_178);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_90);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)
                 &downmix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                  .m_cols);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)&virtualVerts._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)&positionsNominal.
                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar12.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      sVar12.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<ear::PointSourcePanner>)
             sVar12.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
              ::operator*(&__end1_1);
    iVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(this_00);
    iVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(this_00);
    pIVar1 = &downmix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols;
    iVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)pIVar1);
    facetVertsVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::set<int,_std::less<int>,_std::allocator<int>_>::end
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)pIVar1);
    bVar3 = doIntersect<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>>
                      ((_Rb_tree_const_iterator<int>)iVar6._M_node,
                       (_Rb_tree_const_iterator<int>)iVar7._M_node,
                       (_Rb_tree_const_iterator<int>)iVar8._M_node,
                       (_Rb_tree_const_iterator<int>)
                       facetVertsVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    if (!bVar3) {
      sVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(this_00);
      if (sVar9 == 3) {
        iVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(this_00);
        register0x00000000 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(this_00);
        paVar2 = (allocator<int> *)
                 ((long)outputChannels_1.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array + 7);
        std::allocator<int>::allocator(paVar2);
        std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
                  ((vector<int,std::allocator<int>> *)local_390,
                   (_Rb_tree_const_iterator<int>)iVar6._M_node,
                   (_Rb_tree_const_iterator<int>)stack0xfffffffffffffc60,paVar2);
        std::allocator<int>::~allocator
                  ((allocator<int> *)
                   ((long)outputChannels_1.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>
                          .m_storage.m_data.array + 7));
        positions_1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols = (Index)std::vector<int,_std::allocator<int>_>::data
                                  ((vector<int,_std::allocator<int>_> *)local_390);
        Eigen::Matrix<int,3,1,0,3,1>::Matrix<int*>
                  ((Matrix<int,3,1,0,3,1> *)local_3b0,
                   (int **)&positions_1.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols);
        _rowIndex_1 = Eigen::EigenBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::size
                                ((EigenBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)local_3b0);
        __range3._4_4_ = 3;
        Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,int>
                  ((Matrix<double,_1,_1,0,_1,_1> *)local_3d0,(long *)&rowIndex_1,
                   (int *)((long)&__range3 + 4));
        __range3._0_4_ = 0;
        __end3 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(this_00);
        iStack_3f8 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(this_00);
        while (bVar3 = std::operator!=(&__end3,&stack0xfffffffffffffc08), bVar3) {
          piVar10 = std::_Rb_tree_const_iterator<int>::operator*(&__end3);
          local_3fc = *piVar10;
          pDVar11 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                    std::
                    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  *)&positionsNominal.
                                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)local_3fc);
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                    (&local_438,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3d0,
                     (long)(int)__range3);
          Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
                    ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_438,pDVar11);
          __range3._0_4_ = (int)__range3 + 1;
          std::_Rb_tree_const_iterator<int>::operator++(&__end3);
        }
        boost::
        make_unique<ear::Triplet,Eigen::Matrix<int,3,1,0,3,1>&,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                  ((boost *)&facetVertsVec_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,
                   (Matrix<int,_3,_1,_0,_3,_1> *)local_3b0,
                   (Matrix<double,__1,__1,_0,__1,__1> *)local_3d0);
        std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>::
        unique_ptr<ear::Triplet,std::default_delete<ear::Triplet>,void>
                  ((unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>> *)
                   &local_440,
                   (unique_ptr<ear::Triplet,_std::default_delete<ear::Triplet>_> *)
                   &facetVertsVec_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
        ::push_back((vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
                     *)&__range1,(value_type *)&local_440);
        std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>::~unique_ptr
                  (&local_440);
        std::unique_ptr<ear::Triplet,_std::default_delete<ear::Triplet>_>::~unique_ptr
                  ((unique_ptr<ear::Triplet,_std::default_delete<ear::Triplet>_> *)
                   &facetVertsVec_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_3d0);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_390);
      }
      else {
        sVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(this_00);
        if (sVar9 != 4) {
          local_542 = 1;
          this_01 = (internal_error *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_540,"facets with more than 4 vertices are not supported",
                     &local_541);
          internal_error::internal_error(this_01,&local_540);
          local_542 = 0;
          __cxa_throw(this_01,&internal_error::typeinfo,internal_error::~internal_error);
        }
        iVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(this_00);
        iVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(this_00);
        paVar2 = (allocator<int> *)
                 ((long)outputChannels_2.super_PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>.
                        m_storage.m_data.array + 0xf);
        std::allocator<int>::allocator(paVar2);
        std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
                  ((vector<int,std::allocator<int>> *)local_460,
                   (_Rb_tree_const_iterator<int>)iVar6._M_node,
                   (_Rb_tree_const_iterator<int>)iVar7._M_node,paVar2);
        std::allocator<int>::~allocator
                  ((allocator<int> *)
                   ((long)outputChannels_2.super_PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>
                          .m_storage.m_data.array + 0xf));
        positions_2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols = (Index)std::vector<int,_std::allocator<int>_>::data
                                  ((vector<int,_std::allocator<int>_> *)local_460);
        Eigen::Matrix<int,4,1,0,4,1>::Matrix<int*>
                  ((Matrix<int,4,1,0,4,1> *)local_488,
                   (int **)&positions_2.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols);
        _rowIndex_2 = Eigen::EigenBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::size
                                ((EigenBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_> *)local_488);
        __range4._4_4_ = 3;
        Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,int>
                  ((Matrix<double,_1,_1,0,_1,_1> *)local_4a8,(long *)&rowIndex_2,
                   (int *)((long)&__range4 + 4));
        __range4._0_4_ = 0;
        __end4 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(this_00);
        iStack_4d0 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(this_00);
        while (bVar3 = std::operator!=(&__end4,&stack0xfffffffffffffb30), bVar3) {
          piVar10 = std::_Rb_tree_const_iterator<int>::operator*(&__end4);
          local_4d4 = *piVar10;
          pDVar11 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                    std::
                    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  *)&positionsNominal.
                                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)local_4d4);
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                    (&local_510,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_4a8,
                     (long)(int)__range4);
          Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
                    ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_510,pDVar11);
          __range4._0_4_ = (int)__range4 + 1;
          std::_Rb_tree_const_iterator<int>::operator++(&__end4);
        }
        boost::
        make_unique<ear::QuadRegion,Eigen::Matrix<int,4,1,0,4,1>&,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                  ((boost *)&local_520,(Matrix<int,_4,_1,_0,_4,_1> *)local_488,
                   (Matrix<double,__1,__1,_0,__1,__1> *)local_4a8);
        std::unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>>::
        unique_ptr<ear::QuadRegion,std::default_delete<ear::QuadRegion>,void>
                  ((unique_ptr<ear::RegionHandler,std::default_delete<ear::RegionHandler>> *)
                   &local_518,&local_520);
        std::
        vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
        ::push_back((vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
                     *)&__range1,(value_type *)&local_518);
        std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>::~unique_ptr
                  (&local_518);
        std::unique_ptr<ear::QuadRegion,_std::default_delete<ear::QuadRegion>_>::~unique_ptr
                  (&local_520);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_4a8);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_460);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::operator++(&__end1_1);
  } while( true );
}

Assistant:

std::shared_ptr<PointSourcePanner> configureFullPolarPanner(
      const Layout& layout) {
    std::vector<Eigen::Vector3d> positionsReal;
    std::vector<Eigen::Vector3d> positionsNominal;
    std::set<int> virtualVerts;
    Eigen::MatrixXd downmix;
    std::tie(positionsReal, positionsNominal, virtualVerts, downmix) =
        getAugmentedLayout(layout);

    // Facets of the convex hull; each set represents a facet and contains the
    // indices of its corners in positions.
    auto facets_it = FACETS.find(layout.name());
    std::vector<Facet> facets = facets_it != FACETS.end()
                                    ? facets_it->second
                                    : convex_hull(positionsNominal);

    // Turn the facets into regions for the point source panner.
    std::vector<std::unique_ptr<RegionHandler>> regions;

    // Facets adjacent to one of the virtual speakers are turned into virtual
    // ngons, with an equal power downmix from the virtual speaker to the real
    // speakers.
    for (int virtualVert : virtualVerts) {
      Facet realVerts = _adjacent_verts(facets, virtualVert);

      ear_assert(!doIntersect(realVerts.begin(), realVerts.end(),
                              virtualVerts.begin(), virtualVerts.end()),
                 "invalid triangulation");

      std::vector<int> realVertsVec(realVerts.begin(), realVerts.end());
      Eigen::Map<Eigen::VectorXi> outputChannels(realVertsVec.data(),
                                                 realVertsVec.size());
      Eigen::MatrixXd positions(outputChannels.size(), 3);
      int rowIndex = 0;
      for (int vert : realVerts) {
        positions.row(rowIndex) = positionsReal[vert];
        ++rowIndex;
      }
      Eigen::Vector3d centrePosition = positionsReal[virtualVert];
      Eigen::VectorXd centreDownmix(outputChannels.size());
      centreDownmix.fill(1.0 /
                         std::sqrt(static_cast<double>(outputChannels.size())));

      regions.push_back(boost::make_unique<VirtualNgon>(
          outputChannels, positions, centrePosition, centreDownmix));
    }
    // Facets not adjacent to virtual speakers are turned into triplets or
    // quads. In the supported layouts there are never facets with more
    // vertices.
    for (const auto& facetVerts : facets) {
      if (doIntersect(facetVerts.begin(), facetVerts.end(),
                      virtualVerts.begin(), virtualVerts.end())) {
        continue;
      }

      if (facetVerts.size() == 3) {
        std::vector<int> facetVertsVec(facetVerts.begin(), facetVerts.end());
        Eigen::Vector3i outputChannels(facetVertsVec.data());
        Eigen::MatrixXd positions(outputChannels.size(), 3);
        int rowIndex = 0;
        for (int vert : facetVerts) {
          positions.row(rowIndex) = positionsReal[vert];
          ++rowIndex;
        }
        regions.push_back(
            boost::make_unique<Triplet>(outputChannels, positions));
      } else if (facetVerts.size() == 4) {
        std::vector<int> facetVertsVec(facetVerts.begin(), facetVerts.end());
        Eigen::Vector4i outputChannels(facetVertsVec.data());
        Eigen::MatrixXd positions(outputChannels.size(), 3);
        int rowIndex = 0;
        for (int vert : facetVerts) {
          positions.row(rowIndex) = positionsReal[vert];
          ++rowIndex;
        }
        regions.push_back(
            boost::make_unique<QuadRegion>(outputChannels, positions));
      } else {
        throw internal_error(
            "facets with more than 4 vertices are not supported");
      }
    }
    return std::make_shared<PointSourcePannerDownmix>(
        std::make_shared<PolarPointSourcePanner>(std::move(regions)), downmix);
  }